

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::CallIndirectExpr::~CallIndirectExpr(CallIndirectExpr *this)

{
  pointer pTVar1;
  
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__CallIndirectExpr_0019c088;
  Var::~Var(&this->table);
  pTVar1 = (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  pTVar1 = (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  Var::~Var(&(this->decl).type_var);
  operator_delete(this);
  return;
}

Assistant:

explicit CallIndirectExpr(const Location& loc = Location())
      : ExprMixin<ExprType::CallIndirect>(loc) {}